

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance_calculation.cc
# Opt level: O3

bool __thiscall
sptk::DistanceCalculation::Run
          (DistanceCalculation *this,vector<double,_std::allocator<double>_> *vector1,
          vector<double,_std::allocator<double>_> *vector2,double *distance)

{
  ulong uVar1;
  double __x;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (this->is_valid_ != true) {
    return false;
  }
  pdVar4 = (vector1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(vector1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4;
  iVar3 = this->num_order_;
  uVar1 = (long)iVar3 + 1;
  if (lVar8 >> 3 == uVar1) {
    if (distance == (double *)0x0) {
      return false;
    }
    pdVar5 = (vector2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(vector2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar5 != lVar8) {
      return false;
    }
    switch(this->distance_metric_) {
    case kManhattan:
      if (iVar3 < 0) {
LAB_00106382:
        dVar11 = 0.0;
      }
      else {
        dVar11 = 0.0;
        uVar7 = 0;
        do {
          dVar11 = dVar11 + ABS(pdVar4[uVar7] - pdVar5[uVar7]);
          uVar7 = uVar7 + 1;
        } while ((uVar1 & 0xffffffff) != uVar7);
      }
      break;
    case kEuclidean:
      dVar11 = 0.0;
      if (-1 < iVar3) {
        uVar7 = 0;
        do {
          dVar11 = dVar11 + (pdVar4[uVar7] - pdVar5[uVar7]) * (pdVar4[uVar7] - pdVar5[uVar7]);
          uVar7 = uVar7 + 1;
        } while ((uVar1 & 0xffffffff) != uVar7);
      }
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      break;
    case kSquaredEuclidean:
      if (iVar3 < 0) goto LAB_00106382;
      dVar11 = 0.0;
      uVar7 = 0;
      do {
        dVar11 = dVar11 + (pdVar4[uVar7] - pdVar5[uVar7]) * (pdVar4[uVar7] - pdVar5[uVar7]);
        uVar7 = uVar7 + 1;
      } while ((uVar1 & 0xffffffff) != uVar7);
      break;
    case kSymmetricKullbackLeibler:
      if (iVar3 < 0) goto LAB_00106382;
      lVar8 = -1;
      dVar11 = 0.0;
      do {
        __x = pdVar4[lVar8 + 1];
        if ((__x <= 0.0) || (dVar2 = pdVar5[lVar8 + 1], dVar2 <= 0.0))
        goto switchD_00106287_default;
        dVar9 = log(__x);
        dVar10 = log(pdVar5[lVar8 + 1]);
        dVar11 = dVar11 + (dVar9 - dVar10) * (__x - dVar2);
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->num_order_);
      break;
    default:
      goto switchD_00106287_default;
    }
    *distance = dVar11;
    bVar6 = true;
  }
  else {
switchD_00106287_default:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool DistanceCalculation::Run(const std::vector<double>& vector1,
                              const std::vector<double>& vector2,
                              double* distance) const {
  // Check inputs.
  if (!is_valid_ ||
      vector1.size() != static_cast<std::size_t>(num_order_ + 1) ||
      vector2.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == distance) {
    return false;
  }

  const double* x(&(vector1[0]));
  const double* y(&(vector2[0]));

  double sum(0.0);

  switch (distance_metric_) {
    case kManhattan: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += std::fabs(diff);
      }
      break;
    }
    case kEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      sum = std::sqrt(sum);
      break;
    }
    case kSquaredEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      break;
    }
    case kSymmetricKullbackLeibler: {
      for (int m(0); m <= num_order_; ++m) {
        if (x[m] <= 0.0 || y[m] <= 0.0) return false;
        const double diff(x[m] - y[m]);
        const double log_diff(std::log(x[m]) - std::log(y[m]));
        sum += diff * log_diff;
      }
      break;
    }
    default: {
      return false;
    }
  }

  *distance = sum;

  return true;
}